

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int y;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined7 extraout_var;
  CImg<unsigned_char> *pCVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uchar *__src;
  ulong uVar12;
  size_t __n;
  ulong uVar13;
  int z;
  ulong uVar14;
  ulong uVar15;
  uchar *__dest;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar20 [16];
  CImg<unsigned_char> local_50;
  
  bVar4 = is_empty(this);
  if ((!bVar4) && (sprite->_data != (uchar *)0x0)) {
    bVar4 = is_overlapped<unsigned_char>(this,sprite);
    if (bVar4) {
      operator+(&local_50,sprite);
      this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
      ~CImg(&local_50);
    }
    else {
      uVar5 = y0 | x0 | z0 | c0;
      if (uVar5 == 0) {
        bVar4 = is_sameXYZC<unsigned_char>(this,sprite);
        uVar5 = (uint)CONCAT71(extraout_var,bVar4);
        if (((1.0 <= opacity) && (bVar4)) && (this->_is_shared == false)) {
          pCVar8 = assign<unsigned_char>(this,sprite,false);
          return pCVar8;
        }
      }
      uVar18 = -(uint)(x0 < 0) & x0;
      iVar19 = x0 + sprite->_width;
      iVar21 = y0 + sprite->_height;
      iVar22 = z0 + sprite->_depth;
      iVar23 = c0 + sprite->_spectrum;
      iVar17 = sprite->_width + uVar18 +
               (this->_width - iVar19 & -(uint)((int)this->_width < iVar19));
      iVar21 = sprite->_height + (-(uint)(y0 < 0) & y0) +
               (this->_height - iVar21 & -(uint)((int)this->_height < iVar21));
      iVar22 = sprite->_depth + (-(uint)(z0 < 0) & z0) +
               (this->_depth - iVar22 & -(uint)((int)this->_depth < iVar22));
      iVar23 = sprite->_spectrum + (-(uint)(c0 < 0) & c0) +
               (this->_spectrum - iVar23 & -(uint)((int)this->_spectrum < iVar23));
      auVar20._0_4_ = -(uint)(0 < iVar17);
      auVar20._4_4_ = -(uint)(0 < iVar21);
      auVar20._8_4_ = -(uint)(0 < iVar22);
      auVar20._12_4_ = -(uint)(0 < iVar23);
      iVar19 = movmskps(uVar5,auVar20);
      if (iVar19 == 0xf) {
        uVar5 = sprite->_width;
        uVar10 = (ulong)uVar5;
        uVar1 = sprite->_height;
        uVar7 = (ulong)this->_width;
        uVar2 = sprite->_depth;
        uVar3 = this->_height;
        __n = (size_t)iVar17;
        __src = sprite->_data +
                (((-(long)(int)(y0 >> 0x1f & uVar5 * y0) - (long)(int)uVar18) -
                 (long)(int)(z0 >> 0x1f & uVar1 * uVar5 * z0)) -
                (long)(int)(c0 >> 0x1f & uVar2 * c0 * uVar1 * uVar5));
        lVar11 = uVar3 * uVar7;
        uVar5 = this->_depth;
        uVar12 = 0;
        uVar14 = (ulong)(uint)x0;
        if (x0 < 1) {
          uVar14 = uVar12;
        }
        uVar15 = (ulong)(uint)y0;
        if (y0 < 1) {
          uVar15 = uVar12;
        }
        uVar16 = (ulong)(uint)z0;
        if (z0 < 1) {
          uVar16 = uVar12;
        }
        uVar13 = (ulong)(uint)c0;
        if (c0 < 1) {
          uVar13 = uVar12;
        }
        __dest = this->_data + uVar5 * uVar13 * lVar11 + uVar16 * lVar11 + uVar15 * uVar7 + uVar14;
        for (; (int)uVar12 != iVar23; uVar12 = (ulong)((int)uVar12 + 1)) {
          for (iVar19 = 0; iVar19 != iVar22; iVar19 = iVar19 + 1) {
            iVar6 = iVar21;
            if (1.0 <= opacity) {
              while (bVar4 = iVar6 != 0, iVar6 = iVar6 + -1, bVar4) {
                memcpy(__dest,__src,__n);
                __dest = __dest + this->_width;
                __src = __src + sprite->_width;
              }
            }
            else {
              for (iVar6 = 0; iVar6 != iVar21; iVar6 = iVar6 + 1) {
                for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
                  __dest[lVar9] =
                       (uchar)(int)((float)__src[lVar9] * ABS(opacity) +
                                   (float)__dest[lVar9] *
                                   (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity)));
                }
                __dest = __dest + lVar9 + (uVar7 - __n);
                __src = __src + lVar9 + (uVar10 - __n);
              }
            }
            __src = __src + (uVar1 - iVar21) * uVar10;
            __dest = __dest + (uVar3 - iVar21) * uVar7;
          }
          __dest = __dest + (ulong)(uVar5 - iVar22) * lVar11;
          __src = __src + (ulong)(uVar2 - iVar22) * uVar1 * uVar10;
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1)
              for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }